

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

void __thiscall
Catch::ResultBuilder::ResultBuilder
          (ResultBuilder *this,char *macroName,SourceLineInfo *lineInfo,char *capturedExpression,
          Flags resultDisposition)

{
  char *in_RCX;
  string *in_RSI;
  SourceLineInfo *in_RDI;
  AssertionResultData *in_stack_ffffffffffffff30;
  allocator *paVar1;
  SourceLineInfo *_lineInfo;
  AssertionInfo *this_00;
  allocator local_81;
  string local_80 [55];
  undefined1 local_49 [41];
  char *local_20;
  
  this_00 = (AssertionInfo *)local_49;
  _lineInfo = in_RDI;
  local_20 = in_RCX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_49 + 1),(char *)in_RSI,(allocator *)this_00);
  paVar1 = &local_81;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,local_20,paVar1);
  AssertionInfo::AssertionInfo
            (this_00,in_RSI,_lineInfo,&in_RDI->file,(Flags)((ulong)paVar1 >> 0x20));
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::__cxx11::string::~string((string *)(local_49 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_49);
  AssertionResultData::AssertionResultData(in_stack_ffffffffffffff30);
  ExprComponents::ExprComponents((ExprComponents *)&_lineInfo[4].field_0x18);
  CopyableStream::CopyableStream((CopyableStream *)0x17c32a);
  _lineInfo[0x10].field_0x18 = 0;
  _lineInfo[0x10].field_0x19 = 0;
  return;
}

Assistant:

ResultBuilder::ResultBuilder(   char const* macroName,
                                    SourceLineInfo const& lineInfo,
                                    char const* capturedExpression,
                                    ResultDisposition::Flags resultDisposition )
    :   m_assertionInfo( macroName, lineInfo, capturedExpression, resultDisposition ),
        m_shouldDebugBreak( false ),
        m_shouldThrow( false )
    {}